

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlOutputBufferWriteString(void)

{
  int iVar1;
  int iVar2;
  xmlOutputBufferPtr val;
  char *val_00;
  int local_34;
  int n_str;
  char *str;
  int n_out;
  xmlOutputBufferPtr out;
  int ret_val;
  int mem_base;
  int test_ret;
  
  ret_val = 0;
  for (str._4_4_ = 0; (int)str._4_4_ < 2; str._4_4_ = str._4_4_ + 1) {
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      iVar1 = xmlMemBlocks();
      val = gen_xmlOutputBufferPtr(str._4_4_,0);
      val_00 = gen_const_char_ptr(local_34,1);
      iVar2 = xmlOutputBufferWriteString(val,val_00);
      desret_int(iVar2);
      call_tests = call_tests + 1;
      des_xmlOutputBufferPtr(str._4_4_,val,0);
      des_const_char_ptr(local_34,val_00,1);
      xmlResetLastError();
      iVar2 = xmlMemBlocks();
      if (iVar1 != iVar2) {
        iVar2 = xmlMemBlocks();
        printf("Leak of %d blocks found in xmlOutputBufferWriteString",(ulong)(uint)(iVar2 - iVar1))
        ;
        ret_val = ret_val + 1;
        printf(" %d",(ulong)str._4_4_);
        printf(" %d");
        printf("\n");
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val;
}

Assistant:

static int
test_xmlOutputBufferWriteString(void) {
    int test_ret = 0;

#if defined(LIBXML_OUTPUT_ENABLED)
    int mem_base;
    int ret_val;
    xmlOutputBufferPtr out; /* a buffered parser output */
    int n_out;
    const char * str; /* a zero terminated C string */
    int n_str;

    for (n_out = 0;n_out < gen_nb_xmlOutputBufferPtr;n_out++) {
    for (n_str = 0;n_str < gen_nb_const_char_ptr;n_str++) {
        mem_base = xmlMemBlocks();
        out = gen_xmlOutputBufferPtr(n_out, 0);
        str = gen_const_char_ptr(n_str, 1);

        ret_val = xmlOutputBufferWriteString(out, str);
        desret_int(ret_val);
        call_tests++;
        des_xmlOutputBufferPtr(n_out, out, 0);
        des_const_char_ptr(n_str, str, 1);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlOutputBufferWriteString",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_out);
            printf(" %d", n_str);
            printf("\n");
        }
    }
    }
    function_tests++;
#endif

    return(test_ret);
}